

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsSetArrayBufferExtraInfo(JsValueRef arrayBuffer,char extraInfo)

{
  bool bVar1;
  Data DVar2;
  undefined8 in_RAX;
  ArrayBuffer *pAVar3;
  JsErrorCode JVar4;
  DebugCheckNoException local_28;
  
  if (arrayBuffer == (JsValueRef)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    local_28._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
    local_28.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
    local_28.hasException = true;
    DVar2 = ExceptionCheck::Save();
    local_28.__exceptionCheck.handledExceptionType = DVar2.handledExceptionType;
    bVar1 = Js::VarIs<Js::ArrayBuffer>(arrayBuffer);
    JVar4 = JsErrorInvalidArgument;
    if (bVar1) {
      pAVar3 = Js::VarTo<Js::ArrayBuffer>(arrayBuffer);
      (pAVar3->super_ArrayBufferBase).infoBits = extraInfo;
      JVar4 = JsNoError;
    }
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
  }
  return JVar4;
}

Assistant:

END_JSRT_NO_EXCEPTION

}

CHAKRA_API
JsSetArrayBufferExtraInfo(
    _In_ JsValueRef arrayBuffer,
    _In_ char extraInfo)
{
    VALIDATE_JSREF(arrayBuffer);
    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!Js::VarIs<Js::ArrayBuffer>(arrayBuffer))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        Js::VarTo<Js::ArrayBuffer>(arrayBuffer)->SetExtraInfoBits(extraInfo);
    }